

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weak_handle.cpp
# Opt level: O2

void __thiscall polyscope::WeakReferrable::WeakReferrable(WeakReferrable *this)

{
  int *__p;
  uint64_t uVar1;
  
  this->_vptr_WeakReferrable = (_func_int **)&PTR__WeakReferrable_00595698;
  __p = (int *)operator_new(4);
  *__p = 0;
  std::__shared_ptr<int,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<int,void>
            ((__shared_ptr<int,(__gnu_cxx::_Lock_policy)2> *)&this->weakReferrableDummyRef,__p);
  uVar1 = internal::getNextUniqueID();
  this->weakReferableUniqueID = uVar1;
  return;
}

Assistant:

WeakReferrable::WeakReferrable()
    : weakReferrableDummyRef(new WeakHandleDummyType()), weakReferableUniqueID(internal::getNextUniqueID()) {}